

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

String __thiscall Bstrlib::String::splitWhenNoMore(String *this,String *set)

{
  int iVar1;
  bstring in_RDX;
  uchar *extraout_RDX;
  uchar *puVar2;
  uchar *extraout_RDX_00;
  String SVar3;
  
  bninchr(&set->super_tagbstring,0,in_RDX);
  midString(this,(int)set,0);
  iVar1 = bdelete(&set->super_tagbstring,0,(this->super_tagbstring).slen);
  puVar2 = extraout_RDX;
  if (iVar1 == -1) {
    splitWhenNoMore();
    puVar2 = extraout_RDX_00;
  }
  SVar3.super_tagbstring.data = puVar2;
  SVar3.super_tagbstring._0_8_ = this;
  return (String)SVar3.super_tagbstring;
}

Assistant:

const String String::splitWhenNoMore(const String & set)
    {
        int pos = invFindAnyChar(set);
        String ret = midString(0, pos == -1 ? slen : pos);
        if (BSTR_ERR == bdelete(this, 0, ret.slen)) bstringThrow("Failure in remove");
        return ret;
    }